

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLock.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLockLock::ChLinkLockLock(ChLinkLockLock *this,ChLinkLockLock *other)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined1 auVar2 [32];
  __shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  ChLinkLock::ChLinkLock(&this->super_ChLinkLock,&other->super_ChLinkLock);
  (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.super_ChLinkBase.super_ChPhysicsItem.
  super_ChObj._vptr_ChObj = (_func_int **)&PTR__ChLinkLockLock_01162480;
  (this->relC).pos.m_data[0] = 0.0;
  (this->relC).pos.m_data[1] = 0.0;
  (this->relC).pos.m_data[2] = 0.0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->motion_axis).m_data[0] = 0.0;
  (this->motion_axis).m_data[1] = 0.0;
  (this->motion_axis).m_data[2] = 0.0;
  (this->relC).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->relC).rot.m_data + 1) = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->relC).rot.m_data + 3) = ZEXT432(0) << 0x40;
  (this->relC_dt).rot.m_data[0] = 1.0;
  auVar2 = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->relC_dt).rot.m_data + 1) = auVar2;
  *(undefined1 (*) [32])((this->relC_dt).rot.m_data + 3) = auVar2;
  (this->relC_dtdt).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->relC_dtdt).rot.m_data + 1) = auVar2;
  *(undefined1 (*) [32])((this->relC_dtdt).rot.m_data + 3) = auVar2;
  (this->deltaC).rot.m_data[0] = 1.0;
  auVar2 = ZEXT432(0) << 0x40;
  *(undefined1 (*) [32])((this->deltaC).rot.m_data + 3) = auVar2;
  *(undefined1 (*) [32])((this->deltaC).rot.m_data + 1) = auVar2;
  (this->deltaC_dt).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->deltaC_dt).rot.m_data + 3) = auVar2;
  *(undefined1 (*) [32])((this->deltaC_dt).rot.m_data + 1) = auVar2;
  (this->deltaC_dtdt).rot.m_data[0] = 1.0;
  (this->deltaC_dtdt).rot.m_data[1] = 0.0;
  (this->deltaC_dtdt).rot.m_data[2] = 0.0;
  (this->deltaC_dtdt).rot.m_data[3] = 0.0;
  (this->super_ChLinkLock).type = LOCK;
  ChLinkLock::BuildLink(&this->super_ChLinkLock,true,true,true,false,true,true,true);
  iVar1 = (*((other->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,
             (ChFunction *)CONCAT44(extraout_var,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->motion_X).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  iVar1 = (*((other->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,
             (ChFunction *)CONCAT44(extraout_var_00,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->motion_Y).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  iVar1 = (*((other->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,
             (ChFunction *)CONCAT44(extraout_var_01,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->motion_Z).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  iVar1 = (*((other->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr)->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,
             (ChFunction *)CONCAT44(extraout_var_02,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->motion_ang).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>,
             &_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  iVar1 = (*((other->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,
             (ChFunction *)CONCAT44(extraout_var_03,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->motion_ang2).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>
             ,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  iVar1 = (*((other->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->_vptr_ChFunction[2])();
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<chrono::ChFunction,void>
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&_Stack_28,
             (ChFunction *)CONCAT44(extraout_var_04,iVar1));
  std::__shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->motion_ang3).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>
             ,&_Stack_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  if (other != this) {
    (this->motion_axis).m_data[0] = (other->motion_axis).m_data[0];
    (this->motion_axis).m_data[1] = (other->motion_axis).m_data[1];
    (this->motion_axis).m_data[2] = (other->motion_axis).m_data[2];
  }
  this->angleset = other->angleset;
  ChCoordsys<double>::operator=(&this->deltaC,&other->deltaC);
  ChCoordsys<double>::operator=(&this->deltaC_dt,&other->deltaC_dt);
  ChCoordsys<double>::operator=(&this->deltaC_dtdt,&other->deltaC_dtdt);
  ChCoordsys<double>::operator=(&this->relC,&other->relC);
  ChCoordsys<double>::operator=(&this->relC_dt,&other->relC_dt);
  ChCoordsys<double>::operator=(&this->relC_dtdt,&other->relC_dtdt);
  return;
}

Assistant:

ChLinkLockLock::ChLinkLockLock(const ChLinkLockLock& other) : ChLinkLock(other) {
    type = LinkType::LOCK;
    BuildLink(true, true, true, false, true, true, true);

    motion_X = std::shared_ptr<ChFunction>(other.motion_X->Clone());
    motion_Y = std::shared_ptr<ChFunction>(other.motion_Y->Clone());
    motion_Z = std::shared_ptr<ChFunction>(other.motion_Z->Clone());
    motion_ang = std::shared_ptr<ChFunction>(other.motion_ang->Clone());
    motion_ang2 = std::shared_ptr<ChFunction>(other.motion_ang2->Clone());
    motion_ang3 = std::shared_ptr<ChFunction>(other.motion_ang3->Clone());

    motion_axis = other.motion_axis;
    angleset = other.angleset;

    deltaC = other.deltaC;
    deltaC_dt = other.deltaC_dt;
    deltaC_dtdt = other.deltaC_dtdt;
    relC = other.relC;
    relC_dt = other.relC_dt;
    relC_dtdt = other.relC_dtdt;
}